

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_based_part.c
# Opt level: O0

void fill_variance_4x4avg
               (uint8_t *src_buf,int src_stride,int x8_idx,int y8_idx,VP8x8 *vst,int highbd_flag,
               int pixels_wide,int pixels_high,int border_offset_4x4)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  int dst_avg;
  int src_avg;
  int sum;
  uint sse;
  int y4_idx;
  int x4_idx;
  int idx;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_28;
  
  for (local_28 = 0; (int)local_28 < 4; local_28 = local_28 + 1) {
    iVar1 = in_EDX + (local_28 & 1) * 4;
    iVar2 = in_ECX + ((int)local_28 >> 1) * 4;
    local_34 = 0;
    local_38 = 0;
    if ((iVar1 < dst_avg - y4_idx) && (iVar2 < sum - y4_idx)) {
      if ((in_R9D & 8) == 0) {
        local_3c = aom_avg_4x4_sse2((uint8_t *)CONCAT44(x4_idx,y4_idx),sse);
      }
      else {
        local_3c = aom_highbd_avg_4x4_c((uint8_t *)(in_RDI + iVar2 * in_ESI + (long)iVar1),in_ESI);
      }
      local_38 = local_3c - 0x80;
      local_34 = local_38 * local_38;
    }
    fill_variance(local_34,local_38,0,(VPartVar *)(in_R8 + 0x50 + (long)(int)local_28 * 0x90));
  }
  return;
}

Assistant:

static inline void fill_variance_4x4avg(const uint8_t *src_buf, int src_stride,
                                        int x8_idx, int y8_idx, VP8x8 *vst,
#if CONFIG_AV1_HIGHBITDEPTH
                                        int highbd_flag,
#endif
                                        int pixels_wide, int pixels_high,
                                        int border_offset_4x4) {
  for (int idx = 0; idx < 4; idx++) {
    const int x4_idx = x8_idx + GET_BLK_IDX_X(idx, 2);
    const int y4_idx = y8_idx + GET_BLK_IDX_Y(idx, 2);
    unsigned int sse = 0;
    int sum = 0;
    if (x4_idx < pixels_wide - border_offset_4x4 &&
        y4_idx < pixels_high - border_offset_4x4) {
      int src_avg;
      int dst_avg = 128;
#if CONFIG_AV1_HIGHBITDEPTH
      if (highbd_flag & YV12_FLAG_HIGHBITDEPTH) {
        src_avg = aom_highbd_avg_4x4(src_buf + y4_idx * src_stride + x4_idx,
                                     src_stride);
      } else {
        src_avg =
            aom_avg_4x4(src_buf + y4_idx * src_stride + x4_idx, src_stride);
      }
#else
      src_avg = aom_avg_4x4(src_buf + y4_idx * src_stride + x4_idx, src_stride);
#endif

      sum = src_avg - dst_avg;
      sse = sum * sum;
    }
    fill_variance(sse, sum, 0, &vst->split[idx].part_variances.none);
  }
}